

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_case_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,CaseExpression *expr,
          idx_t depth)

{
  pointer pCVar1;
  ClientContext *pCVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  element_type *peVar7;
  bool bVar8;
  type pPVar9;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  type pEVar10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar11;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar12;
  pointer pBVar13;
  BinderException *this_01;
  pointer pCVar14;
  BindResult *pBVar15;
  _Head_base<0UL,_duckdb::BoundCaseExpression_*,_false> local_210;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_208;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_200;
  _Head_base<0UL,_duckdb::BoundCaseExpression_*,_false> local_1f8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  LogicalType then_type;
  LogicalType return_type;
  string local_170;
  string local_150;
  ErrorData error;
  ErrorData local_b0;
  
  local_1e8._8_8_ = __return_storage_ptr__;
  ErrorData::ErrorData(&error);
  pCVar1 = (expr->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
           super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar14 = (expr->case_checks).
                 super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                 super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
                 super__Vector_impl_data._M_start; pCVar14 != pCVar1; pCVar14 = pCVar14 + 1) {
    BindChild(this,&pCVar14->when_expr,depth,&error);
    BindChild(this,&pCVar14->then_expr,depth,&error);
  }
  BindChild(this,&expr->else_expr,depth,&error);
  if (error.initialized == true) {
    ErrorData::ErrorData(&local_b0,&error);
    pBVar15 = (BindResult *)local_1e8._8_8_;
    BindResult::BindResult((BindResult *)local_1e8._8_8_,&local_b0);
    ErrorData::~ErrorData(&local_b0);
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(&expr->else_expr);
    this_00 = BoundExpression::GetExpression(pPVar9);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this_00);
    GetExpressionReturnType(&return_type,pEVar10);
    pCVar1 = (expr->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>
             .super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar14 = (expr->case_checks).
                   super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                   super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar14 != pCVar1; pCVar14 = pCVar14 + 1) {
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(&pCVar14->then_expr);
      puVar11 = BoundExpression::GetExpression(pPVar9);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar11);
      GetExpressionReturnType(&then_type,pEVar10);
      bVar8 = LogicalType::TryGetMaxLogicalType(this->context,&return_type,&then_type,&return_type);
      if (!bVar8) {
        this_01 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_1d8,
                   "Cannot mix values of type %s and %s in CASE expression - an explicit cast is required"
                   ,(allocator *)&local_210);
        LogicalType::ToString_abi_cxx11_(&local_150,&return_type);
        LogicalType::ToString_abi_cxx11_(&local_170,&then_type);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  (this_01,&expr->super_ParsedExpression,(string *)local_1d8,&local_150,&local_170);
        __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::~LogicalType(&then_type);
    }
    make_uniq<duckdb::BoundCaseExpression,duckdb::LogicalType&>((duckdb *)&local_210,&return_type);
    pCVar1 = (expr->case_checks).super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>
             .super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar14 = (expr->case_checks).
                   super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                   super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar14 != pCVar1; pCVar14 = pCVar14 + 1) {
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(&pCVar14->when_expr);
      puVar11 = BoundExpression::GetExpression(pPVar9);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(&pCVar14->then_expr);
      puVar12 = BoundExpression::GetExpression(pPVar9);
      then_type.id_ = INVALID;
      then_type.physical_type_ = ~INVALID;
      then_type._2_6_ = 0;
      then_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pCVar2 = this->context;
      local_200._M_head_impl =
           (puVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      LogicalType::LogicalType((LogicalType *)local_1d8,BOOLEAN);
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_1e8,pCVar2,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_200,(LogicalType *)local_1d8,false);
      uVar6 = then_type._0_8_;
      uVar4 = local_1e8._0_8_;
      local_1e8._0_8_ = (_func_int **)0x0;
      uVar5 = local_1e8._0_8_;
      local_1e8[0] = (undefined1)uVar4;
      local_1e8[1] = SUB81(uVar4,1);
      local_1e8._2_6_ = SUB86(uVar4,2);
      then_type.id_ = local_1e8[0];
      then_type.physical_type_ = local_1e8[1];
      then_type._2_6_ = local_1e8._2_6_;
      if (uVar6 != 0) {
        local_1e8._0_8_ = uVar5;
        (**(code **)(*(long *)uVar6 + 8))();
        if ((_func_int **)local_1e8._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_1e8._0_8_ + 8))();
        }
      }
      local_1e8._0_8_ = (_func_int **)0x0;
      LogicalType::~LogicalType((LogicalType *)local_1d8);
      if (local_200._M_head_impl != (Expression *)0x0) {
        (*((local_200._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_200._M_head_impl = (Expression *)0x0;
      pCVar2 = this->context;
      local_208._M_head_impl =
           (puVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (puVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_1d8,pCVar2,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_208,&return_type,false);
      peVar7 = then_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      then_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1d8._0_8_;
      local_1d8._0_8_ = (_func_int **)0x0;
      if (peVar7 != (element_type *)0x0) {
        (*peVar7->_vptr_ExtraTypeInfo[1])();
        if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
        }
      }
      local_1d8._0_8_ = (Expression *)0x0;
      if (local_208._M_head_impl != (Expression *)0x0) {
        (*((local_208._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_208._M_head_impl = (Expression *)0x0;
      pBVar13 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                              *)&local_210);
      ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::
      emplace_back<duckdb::BoundCaseCheck>
                (&(pBVar13->case_checks).
                  super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>,
                 (BoundCaseCheck *)&then_type);
      BoundCaseCheck::~BoundCaseCheck((BoundCaseCheck *)&then_type);
    }
    pCVar2 = this->context;
    local_1f0._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_1d8,pCVar2,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1f0,&return_type,false);
    pBVar13 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                            *)&local_210);
    uVar4 = local_1d8._0_8_;
    local_1d8._0_8_ = (_func_int **)0x0;
    _Var3._M_head_impl =
         (pBVar13->else_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar13->else_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar4;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_1d8._0_8_ + 8))();
      }
    }
    local_1d8._0_8_ = (Expression *)0x0;
    if (local_1f0._M_head_impl != (Expression *)0x0) {
      (*((local_1f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_1f8._M_head_impl = local_210._M_head_impl;
    local_1f0._M_head_impl = (Expression *)0x0;
    local_210._M_head_impl = (BoundCaseExpression *)0x0;
    BindResult::BindResult
              ((BindResult *)local_1e8._8_8_,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_1f8);
    if (local_1f8._M_head_impl != (BoundCaseExpression *)0x0) {
      (*((local_1f8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_1f8._M_head_impl = (BoundCaseExpression *)0x0;
    if (local_210._M_head_impl != (BoundCaseExpression *)0x0) {
      (*((local_210._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    LogicalType::~LogicalType(&return_type);
    pBVar15 = (BindResult *)local_1e8._8_8_;
  }
  ErrorData::~ErrorData(&error);
  return pBVar15;
}

Assistant:

BindResult ExpressionBinder::BindExpression(CaseExpression &expr, idx_t depth) {
	// first try to bind the children of the case expression
	ErrorData error;
	for (auto &check : expr.case_checks) {
		BindChild(check.when_expr, depth, error);
		BindChild(check.then_expr, depth, error);
	}
	BindChild(expr.else_expr, depth, error);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// the children have been successfully resolved
	// figure out the result type of the CASE expression
	auto &else_expr = BoundExpression::GetExpression(*expr.else_expr);
	auto return_type = ExpressionBinder::GetExpressionReturnType(*else_expr);
	for (auto &check : expr.case_checks) {
		auto &then_expr = BoundExpression::GetExpression(*check.then_expr);
		auto then_type = ExpressionBinder::GetExpressionReturnType(*then_expr);
		if (!LogicalType::TryGetMaxLogicalType(context, return_type, then_type, return_type)) {
			throw BinderException(
			    expr, "Cannot mix values of type %s and %s in CASE expression - an explicit cast is required",
			    return_type.ToString(), then_type.ToString());
		}
	}

	// bind all the individual components of the CASE statement
	auto result = make_uniq<BoundCaseExpression>(return_type);
	for (auto &check : expr.case_checks) {
		auto &when_expr = BoundExpression::GetExpression(*check.when_expr);
		auto &then_expr = BoundExpression::GetExpression(*check.then_expr);
		BoundCaseCheck result_check;
		result_check.when_expr =
		    BoundCastExpression::AddCastToType(context, std::move(when_expr), LogicalType::BOOLEAN);
		result_check.then_expr = BoundCastExpression::AddCastToType(context, std::move(then_expr), return_type);
		result->case_checks.push_back(std::move(result_check));
	}
	result->else_expr = BoundCastExpression::AddCastToType(context, std::move(else_expr), return_type);
	return BindResult(std::move(result));
}